

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O3

void __thiscall ALCdevice::ProcessBs2b(ALCdevice *this,size_t SamplesToDo)

{
  pointer paVar1;
  
  BFormatDec::process((this->AmbiDecoder)._M_t.
                      super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
                      super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
                      super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl,(this->RealOut).Buffer
                      ,(this->Dry).Buffer.mData,SamplesToDo);
  paVar1 = (this->RealOut).Buffer.mData;
  bs2b_cross_feed((this->Bs2b)._M_t.super___uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>._M_t.
                  super__Tuple_impl<0UL,_bs2b_*,_std::default_delete<bs2b>_>.
                  super__Head_base<0UL,_bs2b_*,_false>._M_head_impl,
                  paVar1[(this->RealOut).ChannelIndex._M_elems[0]]._M_elems,
                  paVar1[(this->RealOut).ChannelIndex._M_elems[1]]._M_elems,SamplesToDo);
  return;
}

Assistant:

void ALCdevice::ProcessBs2b(const size_t SamplesToDo)
{
    /* First, decode the ambisonic mix to the "real" output. */
    AmbiDecoder->process(RealOut.Buffer, Dry.Buffer.data(), SamplesToDo);

    /* BS2B is stereo output only. */
    const ALuint lidx{RealOut.ChannelIndex[FrontLeft]};
    const ALuint ridx{RealOut.ChannelIndex[FrontRight]};

    /* Now apply the BS2B binaural/crossfeed filter. */
    bs2b_cross_feed(Bs2b.get(), RealOut.Buffer[lidx].data(), RealOut.Buffer[ridx].data(),
        SamplesToDo);
}